

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Decode
          (Electromagnetic_Emission_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  EmissionSystem local_a8;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Electromagnetic_Emission_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x1c) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_EmittingEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8StateUpdateIndicator);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumberOfEmissionSystems);
  KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  for (local_56 = 0; local_56 < this->m_ui8NumberOfEmissionSystems; local_56 = local_56 + 1) {
    DATA_TYPE::EmissionSystem::EmissionSystem(&local_a8,pKStack_18);
    std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
    push_back(&this->m_vEmissionSystem,&local_a8);
    DATA_TYPE::EmissionSystem::~EmissionSystem(&local_a8);
  }
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ELECTROMAGNETIC_EMISSION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8StateUpdateIndicator
           >> m_ui8NumberOfEmissionSystems
           >> m_ui16Padding;

    for( KUINT8 i = 0; i < m_ui8NumberOfEmissionSystems; ++i )
    {
        m_vEmissionSystem.push_back( EmissionSystem( stream ) );
    }
}